

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

string * Catch::toLower(string *s)

{
  string *in_RSI;
  string *in_RDI;
  string *lc;
  string *in_stack_ffffffffffffffe0;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  toLowerInPlace(in_stack_ffffffffffffffe0);
  return in_RDI;
}

Assistant:

std::string toLower( std::string const& s ) {
        std::string lc = s;
        toLowerInPlace( lc );
        return lc;
    }